

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  string *psVar5;
  char *pcVar6;
  element_type *peVar7;
  byte in_CL;
  Request *in_RDX;
  string *in_RSI;
  ContentProvider *in_RDI;
  shared_ptr<httplib::detail::mmap> mm;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kv;
  const_iterator __end5;
  const_iterator __begin5;
  Headers *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string sub_path;
  MountPointEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  *__range1;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe08;
  Response *in_stack_fffffffffffffe10;
  Request *in_stack_fffffffffffffe18;
  Response *in_stack_fffffffffffffe20;
  Request *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *path_00;
  string *resource_releaser;
  string *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  Response *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffea0;
  string local_140 [36];
  int local_11c;
  _Base_ptr local_118;
  allocator<char> local_f9;
  string local_f8 [32];
  reference local_d8;
  _Self local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c8;
  string local_b8 [48];
  string local_88;
  string local_68 [32];
  reference local_48;
  MountPointEntry *local_40;
  __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
  local_38;
  ContentProvider *local_30;
  byte local_21;
  Request *local_20;
  ContentProvider *user_data;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  local_21 = in_CL & 1;
  local_30 = in_RDI + 4;
  local_20 = in_RDX;
  user_data = in_RDI;
  local_38._M_current =
       (MountPointEntry *)
       std::
       vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
       begin((vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
              *)in_stack_fffffffffffffe08);
  local_40 = (MountPointEntry *)
             std::
             vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
             ::end((vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
                    *)in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
                             *)in_stack_fffffffffffffe08), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
               ::operator*(&local_38);
    resource_releaser = in_RSI + 1;
    psVar5 = (string *)std::__cxx11::string::size();
    iVar4 = std::__cxx11::string::compare((ulong)resource_releaser,0,psVar5);
    if (iVar4 == 0) {
      this_00 = in_RSI + 1;
      std::__cxx11::string::size();
      path_00 = &local_88;
      std::__cxx11::string::substr((ulong)path_00,(ulong)this_00);
      std::operator+((char *)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->version);
      std::__cxx11::string::~string((string *)&local_88);
      uVar2 = detail::is_valid_path(path_00);
      if ((bool)uVar2) {
        std::operator+(in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->method);
        pcVar6 = (char *)std::__cxx11::string::back();
        if (*pcVar6 == '/') {
          std::__cxx11::string::operator+=(local_b8,"index.html");
        }
        uVar3 = detail::is_file((string *)in_stack_fffffffffffffea0);
        if ((bool)uVar3) {
          local_c8._8_8_ = &local_48->headers;
          local_c8._M_allocated_capacity =
               (size_type)
               std::
               multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(in_stack_fffffffffffffe08);
          local_d0._M_node =
               (_Base_ptr)
               std::
               multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(in_stack_fffffffffffffe08);
          while (bVar1 = std::operator!=((_Self *)&local_c8._M_allocated_capacity,&local_d0), bVar1)
          {
            local_d8 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffffe10);
            in_stack_fffffffffffffe30 = local_20;
            in_stack_fffffffffffffe38 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::c_str();
            __a = &local_f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_00,(char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffe48)),__a
                      );
            Response::set_header
                      (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->method,
                       &in_stack_fffffffffffffe10->version);
            std::__cxx11::string::~string(local_f8);
            std::allocator<char>::~allocator(&local_f9);
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffe10);
          }
          local_118 = (_Base_ptr)std::__cxx11::string::c_str();
          std::make_shared<httplib::detail::mmap,char_const*>((char **)in_stack_fffffffffffffe38);
          peVar7 = std::
                   __shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bf5aa);
          bVar1 = detail::mmap::is_open(peVar7);
          if (bVar1) {
            in_stack_fffffffffffffe18 = local_20;
            peVar7 = std::
                     __shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1bf60d);
            in_stack_fffffffffffffe20 = (Response *)detail::mmap::size(peVar7);
            detail::find_content_type
                      ((string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)user_data,in_RSI);
            in_stack_fffffffffffffe10 = (Response *)&stack0xfffffffffffffe90;
            std::shared_ptr<httplib::detail::mmap>::shared_ptr
                      ((shared_ptr<httplib::detail::mmap> *)in_stack_fffffffffffffe10,
                       (shared_ptr<httplib::detail::mmap> *)in_stack_fffffffffffffe08);
            std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::
            function<httplib::Server::handle_file_request(httplib::Request_const&,httplib::Response&,bool)::_lambda(unsigned_long,unsigned_long,httplib::DataSink&)_1_,void>
                      ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                       in_stack_fffffffffffffe20,
                       (anon_class_16_1_3fcf665e *)in_stack_fffffffffffffe18);
            in_stack_fffffffffffffe08 =
                 (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&stack0xfffffffffffffe70;
            std::function<void_(bool)>::function
                      ((function<void_(bool)> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08)
            ;
            Response::set_content_provider
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                       ,in_RDI,(ContentProviderResourceReleaser *)resource_releaser);
            std::function<void_(bool)>::~function((function<void_(bool)> *)0x1bf6b8);
            std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function
                      ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                       0x1bf6c5);
            handle_file_request(httplib::Request_const&,httplib::Response&,bool)::
            {lambda(unsigned_long,unsigned_long,httplib::DataSink&)#1}::~DataSink
                      ((anon_class_16_1_3fcf665e *)0x1bf6d2);
            std::__cxx11::string::~string(local_140);
            if (((local_21 & 1) == 0) &&
               (bVar1 = std::function::operator_cast_to_bool
                                  ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *
                                   )0x1bf6fe), bVar1)) {
              std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                        ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10);
            }
            in_stack_ffffffffffffffff = 1;
          }
          else {
            in_stack_ffffffffffffffff = 0;
          }
          local_11c = 1;
          std::shared_ptr<httplib::detail::mmap>::~shared_ptr
                    ((shared_ptr<httplib::detail::mmap> *)0x1bf7a9);
        }
        else {
          local_11c = 0;
        }
        std::__cxx11::string::~string(local_b8);
        if (local_11c == 0) goto LAB_001bf7f0;
      }
      else {
LAB_001bf7f0:
        local_11c = 0;
      }
      std::__cxx11::string::~string(local_68);
      if (local_11c != 0) goto LAB_001bf844;
    }
    __gnu_cxx::
    __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
    ::operator++(&local_38);
  }
  in_stack_ffffffffffffffff = 0;
LAB_001bf844:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        if (detail::is_file(path)) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first.c_str(), kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}